

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O3

int __thiscall CEditorMap::Load(CEditorMap *this,IStorage *pStorage,char *pFileName,int StorageType)

{
  uchar uVar1;
  CEditor *pCVar2;
  IGraphics *pIVar3;
  undefined8 uVar4;
  CEnvPoint *pCVar5;
  undefined8 uVar6;
  int iVar7;
  bool bVar8;
  int iVar9;
  int *piVar10;
  char *pcVar11;
  CLayerGroup *this_00;
  void *pvVar12;
  CLayerTiles *this_01;
  void *pvVar13;
  CTile *pCVar14;
  CEnvelope *pCVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  int *piVar21;
  CEnvPoint *pCVar22;
  long lVar23;
  int iVar24;
  uint uVar25;
  int iVar26;
  long lVar27;
  long in_FS_OFFSET;
  byte bVar28;
  CEditorImage *pImg;
  int Num;
  int Start;
  CDataFileReader DataFile;
  CEditorImage ImgInfo;
  char aBuf [512];
  void *local_420;
  CEditorImage *local_400;
  int local_3f8;
  int local_3f4;
  CDataFileReader local_3f0;
  CEditorImage local_3e8;
  CEnvelope *local_238 [64];
  long local_38;
  
  bVar28 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3f0.m_pDataFile = (CDatafile *)0x0;
  bVar8 = CDataFileReader::Open(&local_3f0,pStorage,pFileName,StorageType);
  iVar26 = 0;
  if (bVar8) {
    Clean(this);
    iVar26 = 0;
    piVar10 = (int *)CDataFileReader::FindItem(&local_3f0,0,0);
    if ((piVar10 != (int *)0x0) && (*piVar10 == 1)) {
      piVar10 = (int *)CDataFileReader::FindItem(&local_3f0,1,0);
      if ((piVar10 != (int *)0x0) && (*piVar10 == 1)) {
        if (-1 < piVar10[1]) {
          pcVar11 = (char *)CDataFileReader::GetData(&local_3f0,piVar10[1]);
          str_copy((this->m_MapInfo).m_aAuthor,pcVar11,0x20);
        }
        if (-1 < piVar10[2]) {
          pcVar11 = (char *)CDataFileReader::GetData(&local_3f0,piVar10[2]);
          str_copy((this->m_MapInfo).m_aVersion,pcVar11,0x10);
        }
        if (-1 < piVar10[3]) {
          pcVar11 = (char *)CDataFileReader::GetData(&local_3f0,piVar10[3]);
          str_copy((this->m_MapInfo).m_aCredits,pcVar11,0x80);
        }
        if (-1 < piVar10[4]) {
          pcVar11 = (char *)CDataFileReader::GetData(&local_3f0,piVar10[4]);
          str_copy((this->m_MapInfo).m_aLicense,pcVar11,0x20);
        }
      }
      CDataFileReader::GetType(&local_3f0,2,&local_3f4,&local_3f8);
      if (0 < local_3f8) {
        iVar26 = 0;
        do {
          piVar10 = (int *)CDataFileReader::GetItem
                                     (&local_3f0,local_3f4 + iVar26,(int *)0x0,(int *)0x0);
          pcVar11 = (char *)CDataFileReader::GetData(&local_3f0,piVar10[4]);
          local_400 = (CEditorImage *)operator_new(0x1b0);
          pCVar2 = this->m_pEditor;
          (local_400->m_Texture).m_Id = -1;
          local_400->m_pEditor = pCVar2;
          local_400->m_aName[0] = '\0';
          (local_400->super_CImageInfo).m_Width = 0;
          (local_400->super_CImageInfo).m_Height = 0;
          (local_400->super_CImageInfo).m_pData = (void *)0x0;
          (local_400->super_CImageInfo).m_Format = 0;
          local_400->m_pAutoMapper = (IAutoMapper *)0x0;
          iVar9 = piVar10[3];
          local_400->m_External = iVar9;
          if (iVar9 == 0) {
            iVar9 = *piVar10;
            if (iVar9 < 2) {
              iVar18 = piVar10[1];
              (local_400->super_CImageInfo).m_Width = iVar18;
              iVar24 = piVar10[2];
              (local_400->super_CImageInfo).m_Height = iVar24;
              if (iVar9 != 1) {
                uVar16 = piVar10[6];
                goto LAB_001a46c4;
              }
              (local_400->super_CImageInfo).m_Format = 1;
LAB_001a46d9:
              iVar9 = 4;
            }
            else {
              uVar16 = piVar10[6];
              if (1 < uVar16) goto LAB_001a458c;
              iVar18 = piVar10[1];
              (local_400->super_CImageInfo).m_Width = iVar18;
              iVar24 = piVar10[2];
              (local_400->super_CImageInfo).m_Height = iVar24;
LAB_001a46c4:
              (local_400->super_CImageInfo).m_Format = uVar16;
              if (uVar16 == 0) {
                iVar9 = 3;
              }
              else if (uVar16 == 2) {
                iVar9 = 1;
              }
              else {
                if (uVar16 == 1) goto LAB_001a46d9;
                iVar9 = 0;
              }
            }
            pvVar12 = CDataFileReader::GetData(&local_3f0,piVar10[5]);
            uVar16 = iVar24 * iVar18 * iVar9;
            pvVar13 = mem_alloc(uVar16);
            (local_400->super_CImageInfo).m_pData = pvVar13;
            mem_copy(pvVar13,pvVar12,uVar16);
            pIVar3 = this->m_pEditor->m_pGraphics;
            iVar9 = (*(pIVar3->super_IInterface)._vptr_IInterface[0x10])
                              (pIVar3,(ulong)(uint)(local_400->super_CImageInfo).m_Width,
                               (ulong)(uint)(local_400->super_CImageInfo).m_Height,
                               (ulong)(uint)(local_400->super_CImageInfo).m_Format,
                               (local_400->super_CImageInfo).m_pData,0xffffffff,8);
            (local_400->m_Texture).m_Id = iVar9;
          }
          else {
LAB_001a458c:
            str_format((char *)local_238,0x200,"mapres/%s.png",pcVar11);
            local_3e8.m_pEditor = this->m_pEditor;
            local_3e8.m_Texture.m_Id = -1;
            local_3e8.m_External = 0;
            local_3e8.m_aName[0] = '\0';
            local_3e8.super_CImageInfo.m_Width = 0;
            local_3e8.super_CImageInfo.m_Height = 0;
            local_3e8.super_CImageInfo.m_pData = (void *)0x0;
            local_3e8.super_CImageInfo.m_Format = 0;
            local_3e8.m_pAutoMapper = (IAutoMapper *)0x0;
            iVar9 = (*((local_3e8.m_pEditor)->m_pGraphics->super_IInterface)._vptr_IInterface[0xe])
                              ((local_3e8.m_pEditor)->m_pGraphics,&local_3e8,local_238);
            if (iVar9 != 0) {
              memcpy(local_400,&local_3e8,0x1b0);
              pIVar3 = this->m_pEditor->m_pGraphics;
              iVar9 = (*(pIVar3->super_IInterface)._vptr_IInterface[0x10])
                                (pIVar3,local_3e8.super_CImageInfo._0_8_ & 0xffffffff,
                                 (ulong)local_3e8.super_CImageInfo._0_8_ >> 0x20,
                                 (ulong)(uint)local_3e8.super_CImageInfo.m_Format,
                                 local_3e8.super_CImageInfo.m_pData,0xffffffff,8);
              (local_400->m_Texture).m_Id = iVar9;
              local_3e8.super_CImageInfo.m_pData = (void *)0x0;
              local_400->m_External = 1;
            }
            CEditorImage::~CEditorImage(&local_3e8);
          }
          if (pcVar11 != (char *)0x0) {
            str_copy(local_400->m_aName,pcVar11,0x80);
          }
          CEditorImage::LoadAutoMapper(local_400);
          array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::add
                    (&this->m_lImages,&local_400);
          CDataFileReader::UnloadData(&local_3f0,piVar10[5]);
          CDataFileReader::UnloadData(&local_3f0,piVar10[4]);
          iVar26 = iVar26 + 1;
        } while (iVar26 < local_3f8);
      }
      CDataFileReader::GetType(&local_3f0,5,(int *)local_238,(int *)&local_3e8);
      CDataFileReader::GetType(&local_3f0,4,(int *)&local_400,&local_3f4);
      if (0 < local_3f4) {
        iVar26 = 0;
        do {
          piVar10 = (int *)CDataFileReader::GetItem
                                     (&local_3f0,(int)local_400 + iVar26,(int *)0x0,(int *)0x0);
          if (0xfffffffc < *piVar10 - 4U) {
            this_00 = NewGroup(this);
            iVar9 = piVar10[2];
            iVar18 = piVar10[3];
            iVar24 = piVar10[4];
            this_00->m_OffsetX = piVar10[1];
            this_00->m_OffsetY = iVar9;
            this_00->m_ParallaxX = iVar18;
            this_00->m_ParallaxY = iVar24;
            iVar9 = *piVar10;
            if (1 < iVar9) {
              iVar18 = piVar10[8];
              iVar24 = piVar10[9];
              iVar7 = piVar10[10];
              this_00->m_UseClipping = piVar10[7];
              this_00->m_ClipX = iVar18;
              this_00->m_ClipY = iVar24;
              this_00->m_ClipW = iVar7;
              this_00->m_ClipH = piVar10[0xb];
              if (iVar9 != 2) {
                lVar20 = 0;
                do {
                  lVar27 = lVar20;
                  this_00->m_aName[lVar27 * 4] =
                       *(char *)((long)piVar10 + lVar27 * 4 + 0x33) + -0x80;
                  this_00->m_aName[lVar27 * 4 + 1] =
                       *(char *)((long)piVar10 + lVar27 * 4 + 0x32) + -0x80;
                  this_00->m_aName[lVar27 * 4 + 2] =
                       *(char *)((long)piVar10 + lVar27 * 4 + 0x31) + -0x80;
                  this_00->m_aName[lVar27 * 4 + 3] = (char)piVar10[lVar27 + 0xc] + -0x80;
                  lVar20 = lVar27 + 1;
                } while ((int)(lVar27 + 1) != 3);
                this_00->m_aName[lVar27 * 4 + 3] = '\0';
              }
            }
            if (0 < piVar10[6]) {
              iVar9 = 0;
              do {
                pvVar12 = CDataFileReader::GetItem
                                    (&local_3f0,(int)local_238[0] + iVar9 + piVar10[5],(int *)0x0,
                                     (int *)0x0);
                if (pvVar12 != (void *)0x0) {
                  if (*(int *)((long)pvVar12 + 4) == 3) {
                    this_01 = (CLayerTiles *)operator_new(0x40);
                    CLayerQuads::CLayerQuads((CLayerQuads *)this_01);
                    (this_01->super_CLayer).m_pEditor = this->m_pEditor;
                    iVar18 = *(int *)((long)pvVar12 + 0x18);
                    iVar24 = -1;
                    if (iVar18 < (this->m_lImages).num_elements) {
                      iVar24 = iVar18;
                    }
                    if (iVar18 < -1) {
                      iVar24 = -1;
                    }
                    (this_01->m_Texture).m_Id = iVar24;
                    if (1 < *(int *)((long)pvVar12 + 0xc)) {
                      lVar20 = 0;
                      do {
                        lVar27 = lVar20;
                        (this_01->super_CLayer).m_aName[lVar27 * 4] =
                             *(char *)((long)pvVar12 + lVar27 * 4 + 0x1f) + -0x80;
                        (this_01->super_CLayer).m_aName[lVar27 * 4 + 1] =
                             *(char *)((long)pvVar12 + lVar27 * 4 + 0x1e) + -0x80;
                        (this_01->super_CLayer).m_aName[lVar27 * 4 + 2] =
                             *(char *)((long)pvVar12 + lVar27 * 4 + 0x1d) + -0x80;
                        (this_01->super_CLayer).m_aName[lVar27 * 4 + 3] =
                             *(char *)((long)pvVar12 + lVar27 * 4 + 0x1c) + -0x80;
                        lVar20 = lVar27 + 1;
                      } while ((int)(lVar27 + 1) != 3);
                      (this_01->super_CLayer).m_aName[lVar27 * 4 + 3] = '\0';
                    }
                    pvVar13 = CDataFileReader::GetDataSwapped
                                        (&local_3f0,*(int *)((long)pvVar12 + 0x14));
                    CLayerGroup::AddLayer(this_00,(CLayer *)this_01);
                    iVar18 = *(int *)((long)pvVar12 + 0x10);
                    iVar24 = iVar18;
                    if (this_01->m_Height < iVar18) {
                      array<CQuad,_allocator_default<CQuad>_>::alloc
                                ((array<CQuad,_allocator_default<CQuad>_> *)&this_01->m_Image,iVar18
                                );
                      iVar24 = *(int *)((long)pvVar12 + 0x10);
                    }
                    (this_01->m_Color).r = iVar18;
                    mem_copy(((array<CQuad,_allocator_default<CQuad>_> *)&this_01->m_Image)->list,
                             pvVar13,iVar24 * 0x98);
                    CDataFileReader::UnloadData(&local_3f0,*(int *)((long)pvVar12 + 0x14));
                  }
                  else {
                    if (*(int *)((long)pvVar12 + 4) != 2) goto LAB_001a4b50;
                    if ((*(byte *)((long)pvVar12 + 0x18) & 1) == 0) {
                      this_01 = (CLayerTiles *)operator_new(0x80);
                      CLayerTiles::CLayerTiles
                                (this_01,*(int *)((long)pvVar12 + 0x10),
                                 *(int *)((long)pvVar12 + 0x14));
                      (this_01->super_CLayer).m_pEditor = this->m_pEditor;
                      uVar4 = *(undefined8 *)((long)pvVar12 + 0x1c);
                      uVar6 = *(undefined8 *)((long)pvVar12 + 0x24);
                      (this_01->m_Color).r = (int)uVar4;
                      (this_01->m_Color).g = (int)((ulong)uVar4 >> 0x20);
                      (this_01->m_Color).b = (int)uVar6;
                      (this_01->m_Color).a = (int)((ulong)uVar6 >> 0x20);
                      uVar4 = *(undefined8 *)((long)pvVar12 + 0x2c);
                      this_01->m_ColorEnv = (int)uVar4;
                      this_01->m_ColorEnvOffset = (int)((ulong)uVar4 >> 0x20);
                    }
                    else {
                      this_01 = (CLayerTiles *)operator_new(0x80);
                      CLayerGame::CLayerGame
                                ((CLayerGame *)this_01,*(int *)((long)pvVar12 + 0x10),
                                 *(int *)((long)pvVar12 + 0x14));
                      MakeGameLayer(this,(CLayer *)this_01);
                      MakeGameGroup(this,this_00);
                    }
                    CLayerGroup::AddLayer(this_00,&this_01->super_CLayer);
                    pCVar14 = (CTile *)CDataFileReader::GetData
                                                 (&local_3f0,*(int *)((long)pvVar12 + 0x38));
                    this_01->m_Image = *(int *)((long)pvVar12 + 0x34);
                    this_01->m_Game = *(uint *)((long)pvVar12 + 0x18) & 1;
                    if (*(int *)((long)pvVar12 + 0xc) < 3) {
LAB_001a4ae4:
                      mem_copy(this_01->m_pTiles,pCVar14,this_01->m_Width * this_01->m_Height * 4);
                    }
                    else {
                      lVar20 = 0;
                      do {
                        lVar27 = lVar20;
                        (this_01->super_CLayer).m_aName[lVar27 * 4] =
                             *(char *)((long)pvVar12 + lVar27 * 4 + 0x3f) + -0x80;
                        (this_01->super_CLayer).m_aName[lVar27 * 4 + 1] =
                             *(char *)((long)pvVar12 + lVar27 * 4 + 0x3e) + -0x80;
                        (this_01->super_CLayer).m_aName[lVar27 * 4 + 2] =
                             *(char *)((long)pvVar12 + lVar27 * 4 + 0x3d) + -0x80;
                        (this_01->super_CLayer).m_aName[lVar27 * 4 + 3] =
                             *(char *)((long)pvVar12 + lVar27 * 4 + 0x3c) + -0x80;
                        lVar20 = lVar27 + 1;
                      } while ((int)(lVar27 + 1) != 3);
                      (this_01->super_CLayer).m_aName[lVar27 * 4 + 3] = '\0';
                      if (*(int *)((long)pvVar12 + 0xc) < 4) goto LAB_001a4ae4;
                      CLayerTiles::ExtractTiles(this_01,pCVar14);
                    }
                    if (((this_01->m_Game != 0) && (*(int *)((long)pvVar12 + 0xc) == 0x10048)) &&
                       (uVar16 = this_01->m_Height * this_01->m_Width, 0 < (int)uVar16)) {
                      pCVar14 = this_01->m_pTiles;
                      uVar19 = 0;
                      do {
                        uVar1 = pCVar14[uVar19].m_Index;
                        if (uVar1 != '\0') {
                          pCVar14[uVar19].m_Index = uVar1 + 0xbf;
                        }
                        uVar19 = uVar19 + 1;
                      } while (uVar16 != uVar19);
                    }
                    CDataFileReader::UnloadData(&local_3f0,*(int *)((long)pvVar12 + 0x38));
                  }
                  (this_01->super_CLayer).m_Flags = *(int *)((long)pvVar12 + 8);
                }
LAB_001a4b50:
                iVar9 = iVar9 + 1;
              } while (iVar9 < piVar10[6]);
            }
          }
          iVar26 = iVar26 + 1;
        } while (iVar26 < local_3f4);
      }
      CDataFileReader::GetType(&local_3f0,6,(int *)local_238,(int *)&local_3e8);
      if (local_3e8.super_CImageInfo.m_Width == 0) {
        local_420 = (void *)0x0;
      }
      else {
        local_420 = CDataFileReader::GetItem(&local_3f0,(int)local_238[0],(int *)0x0,(int *)0x0);
      }
      CDataFileReader::GetType(&local_3f0,3,(int *)&local_3e8,(int *)&local_400);
      if (0 < (int)local_400) {
        iVar26 = 0;
        do {
          piVar10 = (int *)CDataFileReader::GetItem
                                     (&local_3f0,local_3e8.super_CImageInfo.m_Width + iVar26,
                                      (int *)0x0,(int *)0x0);
          uVar16 = piVar10[1];
          uVar25 = 4;
          if ((int)uVar16 < 4) {
            uVar25 = uVar16;
          }
          pCVar15 = (CEnvelope *)operator_new(0x48);
          (pCVar15->m_lPoints).list = (CEnvPoint *)0x0;
          array<CEnvPoint,_allocator_default<CEnvPoint>_>::clear(&pCVar15->m_lPoints);
          pCVar15->m_Channels = uVar25;
          pCVar15->m_aName[0] = '\0';
          pCVar15->m_Bottom = 0.0;
          pCVar15->m_Top = 0.0;
          pCVar15->m_Synchronized = true;
          iVar9 = piVar10[3];
          iVar18 = iVar9;
          local_238[0] = pCVar15;
          if ((pCVar15->m_lPoints).list_size < iVar9) {
            array<CEnvPoint,_allocator_default<CEnvPoint>_>::alloc(&pCVar15->m_lPoints,iVar9);
            iVar18 = piVar10[3];
          }
          (pCVar15->m_lPoints).num_elements = iVar9;
          if (0 < iVar18) {
            lVar27 = 8;
            lVar20 = 0;
            do {
              pCVar22 = (local_238[0]->m_lPoints).list + lVar20;
              lVar23 = (long)(piVar10[2] + (int)lVar20);
              if (*piVar10 < 3) {
                mem_zero(pCVar22,0x58);
                pCVar5 = (local_238[0]->m_lPoints).list;
                uVar4 = *(undefined8 *)((long)local_420 + lVar23 * 0x18);
                pCVar22 = pCVar5 + lVar20;
                (pCVar22->super_CEnvPoint_v1).m_Time = (int)uVar4;
                (pCVar22->super_CEnvPoint_v1).m_Curvetype = (int)((ulong)uVar4 >> 0x20);
                if (0 < (int)uVar16) {
                  uVar19 = 0;
                  do {
                    *(undefined4 *)
                     ((long)(pCVar5->super_CEnvPoint_v1).m_aValues + uVar19 * 4 + lVar27 + -8) =
                         *(undefined4 *)((long)local_420 + uVar19 * 4 + lVar23 * 0x18 + 8);
                    uVar19 = uVar19 + 1;
                  } while (uVar25 != uVar19);
                }
              }
              else {
                piVar21 = (int *)(lVar23 * 0x58 + (long)local_420);
                for (lVar17 = 0x16; lVar17 != 0; lVar17 = lVar17 + -1) {
                  (pCVar22->super_CEnvPoint_v1).m_Time = *piVar21;
                  piVar21 = piVar21 + (ulong)bVar28 * -2 + 1;
                  pCVar22 = (CEnvPoint *)((long)pCVar22 + ((ulong)bVar28 * -2 + 1) * 4);
                }
              }
              lVar20 = lVar20 + 1;
              lVar27 = lVar27 + 0x58;
            } while (lVar20 < piVar10[3]);
          }
          if (piVar10[4] != -1) {
            lVar20 = 0;
            do {
              lVar27 = lVar20;
              local_238[0]->m_aName[lVar27 * 4] =
                   *(char *)((long)piVar10 + lVar27 * 4 + 0x13) + -0x80;
              local_238[0]->m_aName[lVar27 * 4 + 1] =
                   *(char *)((long)piVar10 + lVar27 * 4 + 0x12) + -0x80;
              local_238[0]->m_aName[lVar27 * 4 + 2] =
                   *(char *)((long)piVar10 + lVar27 * 4 + 0x11) + -0x80;
              local_238[0]->m_aName[lVar27 * 4 + 3] = (char)piVar10[lVar27 + 4] + -0x80;
              lVar20 = lVar27 + 1;
            } while ((int)(lVar27 + 1) != 8);
            local_238[0]->m_aName[lVar27 * 4 + 3] = '\0';
          }
          array<CEnvelope_*,_allocator_default<CEnvelope_*>_>::add(&this->m_lEnvelopes,local_238);
          if (1 < *piVar10) {
            local_238[0]->m_Synchronized = piVar10[0xc] != 0;
          }
          iVar26 = iVar26 + 1;
        } while (iVar26 < (int)local_400);
      }
      iVar26 = 1;
    }
  }
  CDataFileReader::Close(&local_3f0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar26;
}

Assistant:

int CEditorMap::Load(class IStorage *pStorage, const char *pFileName, int StorageType)
{
	CDataFileReader DataFile;
	if(!DataFile.Open(pStorage, pFileName, StorageType))
		return 0;

	Clean();

	// check version
	CMapItemVersion *pItem = (CMapItemVersion *)DataFile.FindItem(MAPITEMTYPE_VERSION, 0);
	if(!pItem)
	{
		return 0;
	}
	else if(pItem->m_Version == CMapItemVersion::CURRENT_VERSION)
	{
		// load map info
		{
			CMapItemInfo *pItem = (CMapItemInfo *)DataFile.FindItem(MAPITEMTYPE_INFO, 0);
			if(pItem && pItem->m_Version == 1)
			{
				if(pItem->m_Author > -1)
					str_copy(m_MapInfo.m_aAuthor, (char *)DataFile.GetData(pItem->m_Author), sizeof(m_MapInfo.m_aAuthor));
				if(pItem->m_MapVersion > -1)
					str_copy(m_MapInfo.m_aVersion, (char *)DataFile.GetData(pItem->m_MapVersion), sizeof(m_MapInfo.m_aVersion));
				if(pItem->m_Credits > -1)
					str_copy(m_MapInfo.m_aCredits, (char *)DataFile.GetData(pItem->m_Credits), sizeof(m_MapInfo.m_aCredits));
				if(pItem->m_License > -1)
					str_copy(m_MapInfo.m_aLicense, (char *)DataFile.GetData(pItem->m_License), sizeof(m_MapInfo.m_aLicense));
			}
		}

		// load images
		{
			int Start, Num;
			DataFile.GetType( MAPITEMTYPE_IMAGE, &Start, &Num);
			for(int i = 0; i < Num; i++)
			{
				CMapItemImage *pItem = (CMapItemImage *)DataFile.GetItem(Start+i, 0, 0);
				char *pName = (char *)DataFile.GetData(pItem->m_ImageName);

				// copy base info
				CEditorImage *pImg = new CEditorImage(m_pEditor);
				pImg->m_External = pItem->m_External;

				if(pItem->m_External || (pItem->m_Version > 1 && pItem->m_Format != CImageInfo::FORMAT_RGB && pItem->m_Format != CImageInfo::FORMAT_RGBA))
				{
					char aBuf[IO_MAX_PATH_LENGTH];
					str_format(aBuf, sizeof(aBuf),"mapres/%s.png", pName);

					// load external
					CEditorImage ImgInfo(m_pEditor);
					if(m_pEditor->Graphics()->LoadPNG(&ImgInfo, aBuf, IStorage::TYPE_ALL))
					{
						*pImg = ImgInfo;
						pImg->m_Texture = m_pEditor->Graphics()->LoadTextureRaw(ImgInfo.m_Width, ImgInfo.m_Height, ImgInfo.m_Format, ImgInfo.m_pData, CImageInfo::FORMAT_AUTO, IGraphics::TEXLOAD_MULTI_DIMENSION);
						ImgInfo.m_pData = 0;
						pImg->m_External = 1;
					}
				}
				else
				{
					pImg->m_Width = pItem->m_Width;
					pImg->m_Height = pItem->m_Height;
					pImg->m_Format = pItem->m_Version == 1 ? CImageInfo::FORMAT_RGBA : pItem->m_Format;

					// copy image data
					const int DataSize = pImg->m_Width * pImg->m_Height * pImg->GetPixelSize();
					void *pData = DataFile.GetData(pItem->m_ImageData);
					pImg->m_pData = mem_alloc(DataSize);
					mem_copy(pImg->m_pData, pData, DataSize);
					pImg->m_Texture = m_pEditor->Graphics()->LoadTextureRaw(pImg->m_Width, pImg->m_Height, pImg->m_Format, pImg->m_pData, CImageInfo::FORMAT_AUTO, IGraphics::TEXLOAD_MULTI_DIMENSION);
				}

				// copy image name
				if(pName)
					str_copy(pImg->m_aName, pName, 128);

				// load auto mapper file
				pImg->LoadAutoMapper();

				m_lImages.add(pImg);

				// unload image
				DataFile.UnloadData(pItem->m_ImageData);
				DataFile.UnloadData(pItem->m_ImageName);
			}
		}

		// load groups
		{
			int LayersStart, LayersNum;
			DataFile.GetType(MAPITEMTYPE_LAYER, &LayersStart, &LayersNum);

			int Start, Num;
			DataFile.GetType(MAPITEMTYPE_GROUP, &Start, &Num);
			for(int g = 0; g < Num; g++)
			{
				CMapItemGroup *pGItem = (CMapItemGroup *)DataFile.GetItem(Start+g, 0, 0);

				if(pGItem->m_Version < 1 || pGItem->m_Version > CMapItemGroup::CURRENT_VERSION)
					continue;

				CLayerGroup *pGroup = NewGroup();
				pGroup->m_ParallaxX = pGItem->m_ParallaxX;
				pGroup->m_ParallaxY = pGItem->m_ParallaxY;
				pGroup->m_OffsetX = pGItem->m_OffsetX;
				pGroup->m_OffsetY = pGItem->m_OffsetY;

				if(pGItem->m_Version >= 2)
				{
					pGroup->m_UseClipping = pGItem->m_UseClipping;
					pGroup->m_ClipX = pGItem->m_ClipX;
					pGroup->m_ClipY = pGItem->m_ClipY;
					pGroup->m_ClipW = pGItem->m_ClipW;
					pGroup->m_ClipH = pGItem->m_ClipH;
				}

				// load group name
				if(pGItem->m_Version >= 3)
					IntsToStr(pGItem->m_aName, sizeof(pGroup->m_aName)/sizeof(int), pGroup->m_aName);

				for(int l = 0; l < pGItem->m_NumLayers; l++)
				{
					CLayer *pLayer = 0;
					CMapItemLayer *pLayerItem = (CMapItemLayer *)DataFile.GetItem(LayersStart+pGItem->m_StartLayer+l, 0, 0);
					if(!pLayerItem)
						continue;

					if(pLayerItem->m_Type == LAYERTYPE_TILES)
					{
						CMapItemLayerTilemap *pTilemapItem = (CMapItemLayerTilemap *)pLayerItem;
						CLayerTiles *pTiles = 0;

						if(pTilemapItem->m_Flags&TILESLAYERFLAG_GAME)
						{
							pTiles = new CLayerGame(pTilemapItem->m_Width, pTilemapItem->m_Height);
							MakeGameLayer(pTiles);
							MakeGameGroup(pGroup);
						}
						else
						{
							pTiles = new CLayerTiles(pTilemapItem->m_Width, pTilemapItem->m_Height);
							pTiles->m_pEditor = m_pEditor;
							pTiles->m_Color = pTilemapItem->m_Color;
							pTiles->m_ColorEnv = pTilemapItem->m_ColorEnv;
							pTiles->m_ColorEnvOffset = pTilemapItem->m_ColorEnvOffset;
						}

						pLayer = pTiles;

						pGroup->AddLayer(pTiles);
						void *pData = DataFile.GetData(pTilemapItem->m_Data);
						pTiles->m_Image = pTilemapItem->m_Image;
						pTiles->m_Game = pTilemapItem->m_Flags&TILESLAYERFLAG_GAME;

						// load layer name
						if(pTilemapItem->m_Version >= 3)
							IntsToStr(pTilemapItem->m_aName, sizeof(pTiles->m_aName)/sizeof(int), pTiles->m_aName);

						// get tile data
						if(pTilemapItem->m_Version > 3)
							pTiles->ExtractTiles((CTile *)pData);
						else
							mem_copy(pTiles->m_pTiles, pData, pTiles->m_Width*pTiles->m_Height*sizeof(CTile));


						if(pTiles->m_Game && pTilemapItem->m_Version == MakeVersion(1, *pTilemapItem))
						{
							for(int i = 0; i < pTiles->m_Width*pTiles->m_Height; i++)
							{
								if(pTiles->m_pTiles[i].m_Index)
									pTiles->m_pTiles[i].m_Index += ENTITY_OFFSET;
							}
						}

						DataFile.UnloadData(pTilemapItem->m_Data);
					}
					else if(pLayerItem->m_Type == LAYERTYPE_QUADS)
					{
						CMapItemLayerQuads *pQuadsItem = (CMapItemLayerQuads *)pLayerItem;
						CLayerQuads *pQuads = new CLayerQuads;
						pQuads->m_pEditor = m_pEditor;
						pLayer = pQuads;
						pQuads->m_Image = pQuadsItem->m_Image;
						if(pQuads->m_Image < -1 || pQuads->m_Image >= m_lImages.size())
							pQuads->m_Image = -1;

						// load layer name
						if(pQuadsItem->m_Version >= 2)
							IntsToStr(pQuadsItem->m_aName, sizeof(pQuads->m_aName)/sizeof(int), pQuads->m_aName);

						void *pData = DataFile.GetDataSwapped(pQuadsItem->m_Data);
						pGroup->AddLayer(pQuads);
						pQuads->m_lQuads.set_size(pQuadsItem->m_NumQuads);
						mem_copy(pQuads->m_lQuads.base_ptr(), pData, sizeof(CQuad)*pQuadsItem->m_NumQuads);
						DataFile.UnloadData(pQuadsItem->m_Data);
					}

					if(pLayer)
						pLayer->m_Flags = pLayerItem->m_Flags;
				}
			}
		}

		// load envelopes
		{
			CEnvPoint *pEnvPoints = 0;
			{
				int Start, Num;
				DataFile.GetType(MAPITEMTYPE_ENVPOINTS, &Start, &Num);
				if(Num)
					pEnvPoints = (CEnvPoint *)DataFile.GetItem(Start, 0, 0);
			}

			int Start, Num;
			DataFile.GetType(MAPITEMTYPE_ENVELOPE, &Start, &Num);
			for(int e = 0; e < Num; e++)
			{
				CMapItemEnvelope *pItem = (CMapItemEnvelope *)DataFile.GetItem(Start+e, 0, 0);
				const int Channels = minimum(pItem->m_Channels, 4);
				CEnvelope *pEnv = new CEnvelope(Channels);
				pEnv->m_lPoints.set_size(pItem->m_NumPoints);
				for(int n = 0; n < pItem->m_NumPoints; n++)
				{
					if(pItem->m_Version >= 3)
					{
						pEnv->m_lPoints[n] = pEnvPoints[pItem->m_StartPoint + n];
					}
					else
					{
						// backwards compatibility
						CEnvPoint_v1 *pEnvPoint_v1 = &((CEnvPoint_v1 *)pEnvPoints)[pItem->m_StartPoint + n];
						mem_zero((void*)&pEnv->m_lPoints[n], sizeof(CEnvPoint));

						pEnv->m_lPoints[n].m_Time = pEnvPoint_v1->m_Time;
						pEnv->m_lPoints[n].m_Curvetype = pEnvPoint_v1->m_Curvetype;

						for(int c = 0; c < Channels; c++)
						{
							pEnv->m_lPoints[n].m_aValues[c] = pEnvPoint_v1->m_aValues[c];
						}
					}
				}

				if(pItem->m_aName[0] != -1)	// compatibility with old maps
					IntsToStr(pItem->m_aName, sizeof(pItem->m_aName)/sizeof(int), pEnv->m_aName);
				m_lEnvelopes.add(pEnv);
				if(pItem->m_Version >= 2)
					pEnv->m_Synchronized = pItem->m_Synchronized;
			}
		}
	}
	else
		return 0;

	return 1;
}